

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddTestCommand.cxx
# Opt level: O1

bool cmAddTestCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  cmMakefile *pcVar1;
  int iVar2;
  cmTest *pcVar3;
  undefined8 uVar4;
  cmTestGenerator *pcVar5;
  bool bVar6;
  pointer *__ptr;
  ulong uVar7;
  pointer pbVar8;
  string *psVar9;
  ulong uVar10;
  ulong uVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string working_directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command_1;
  size_type __dnew;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  undefined1 local_138 [16];
  undefined1 local_128 [32];
  string local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  undefined1 local_98 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pbVar8 == (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) ||
     (iVar2 = std::__cxx11::string::compare((char *)pbVar8), iVar2 != 0)) {
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)__last._M_current - (long)pbVar8) < 0x21) {
      local_138._0_8_ = (pointer)local_128;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,"called with incorrect number of arguments","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((pointer)local_138._0_8_ != (pointer)local_128) {
        operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
      }
      return false;
    }
    pcVar1 = status->Makefile;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
               pbVar8 + 1,__last,(allocator_type *)local_138);
    pcVar3 = cmMakefile::GetTest(pcVar1,(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start);
    if (pcVar3 == (cmTest *)0x0) {
      pcVar3 = cmMakefile::CreateTest
                         (pcVar1,(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      pcVar3->OldStyle = true;
      pcVar5 = (cmTestGenerator *)operator_new(0x88);
      local_138._0_8_ = (pointer)0x0;
      local_138._8_8_ = (pointer)0x0;
      local_128._0_8_ = (pointer)0x0;
      cmTestGenerator::cmTestGenerator
                (pcVar5,pcVar3,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_138);
      local_e8._M_allocated_capacity = (size_type)pcVar5;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
      cmMakefile::AddTestGenerator
                (pcVar1,(unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_> *)
                        &local_e8._M_allocated_capacity);
      if ((cmTestGenerator *)local_e8._M_allocated_capacity != (cmTestGenerator *)0x0) {
        (**(code **)(*(long *)local_e8._M_allocated_capacity + 8))();
      }
      local_e8._M_allocated_capacity = 0;
    }
    else if (pcVar3->OldStyle == false) {
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_128._8_8_ = (pbVar8->_M_dataplus)._M_p;
      local_128._0_8_ = pbVar8->_M_string_length;
      local_138._0_8_ = (pointer)0x12;
      local_138._8_8_ = " given test name \"";
      local_128._16_8_ = 0x29;
      local_128._24_8_ = "\" which already exists in this directory.";
      views._M_len = 3;
      views._M_array = (iterator)local_138;
      cmCatViews_abi_cxx11_((string *)local_98,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_,(ulong)((long)local_88._M_dataplus._M_p + 1));
      }
      bVar6 = false;
      goto LAB_001a9499;
    }
    bVar6 = true;
    cmTest::SetCommand(pcVar3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_108);
LAB_001a9499:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_108);
    return bVar6;
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  uVar11 = 0;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar4 = uVar11;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8)) {
    local_e8._8_8_ = 0;
    uVar7 = 1;
    uVar10 = 2;
    do {
      iVar2 = std::__cxx11::string::compare((char *)(pbVar8 + uVar7));
      if (iVar2 == 0) {
        uVar11 = 1;
        if (local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_138._0_8_ = local_128;
          local_98._0_8_ = (pointer)0x22;
          local_138._0_8_ = std::__cxx11::string::_M_create((ulong *)local_138,(ulong)local_98);
          local_128._0_8_ = local_98._0_8_;
          (((pointer)local_138._0_8_)->field_2)._M_allocated_capacity = 0x6e6f2074736f6d20;
          builtin_strncpy((char *)((long)&((pointer)local_138._0_8_)->field_2 + 8),"e COMMAN",8);
          (((pointer)local_138._0_8_)->_M_dataplus)._M_p = (pointer)0x2065622079616d20;
          ((pointer)local_138._0_8_)->_M_string_length = 0x7461206e65766967;
          *(undefined2 *)&(((pointer)(local_138._0_8_ + 0x20))->_M_dataplus)._M_p = 0x2e44;
          local_138._8_8_ = local_98._0_8_;
          *(char *)(local_98._0_8_ + (long)&((pointer)local_138._0_8_)->_M_dataplus) = '\0';
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_001a975d;
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar7));
        if (iVar2 == 0) {
          uVar11 = 2;
          if (local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_138._0_8_ = local_128;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_138," may be given at most one set of CONFIGURATIONS.","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_001a975d;
          }
        }
        else {
          iVar2 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar7));
          if (iVar2 == 0) {
            uVar11 = 3;
            if (local_d8._M_string_length != 0) {
              local_138._0_8_ = local_128;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_138," may be given at most one WORKING_DIRECTORY.","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_001a975d;
            }
          }
          else {
            uVar4 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar7));
            if ((int)uVar4 == 0) {
              if ((local_e8._8_8_ & 1) != 0) {
                local_138._0_8_ = local_128;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_138," may be given at most one COMMAND_EXPAND_LISTS.","")
                ;
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_001a975d;
              }
              uVar11 = 4;
              local_e8._8_8_ = CONCAT71((int7)((ulong)uVar4 >> 8),1);
            }
            else {
              if (3 < (uint)uVar11) {
                local_138._0_8_ = (pointer)0x1b;
                local_138._8_8_ = " given unknown argument:\n  ";
                pbVar8 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_98._8_8_ = pbVar8[uVar7]._M_dataplus._M_p;
                local_98._0_8_ = pbVar8[uVar7]._M_string_length;
                cmStrCat<char[2]>(&local_50,(cmAlphaNum *)local_138,(cmAlphaNum *)local_98,
                                  (char (*) [2])0x6b3282);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_001a9773;
                goto LAB_001a976b;
              }
              psVar9 = &local_108;
              switch(uVar11) {
              case 1:
                uVar11 = 1;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_b8,
                            (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7);
                break;
              case 2:
                uVar11 = 2;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_68,
                            (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7);
                break;
              case 3:
                psVar9 = &local_d8;
              case 0:
                uVar11 = 4;
                std::__cxx11::string::_M_assign((string *)psVar9);
              }
            }
          }
        }
      }
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar6 = uVar10 < (ulong)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5
                              );
      uVar7 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
      uVar4 = local_e8._8_8_;
    } while (bVar6);
  }
  if ((pointer)local_108._M_string_length == (pointer)0x0) {
    local_138._0_8_ = local_128;
    local_98._0_8_ = &DAT_0000001e;
    local_138._0_8_ = std::__cxx11::string::_M_create((ulong *)local_138,(ulong)local_98);
    local_128._0_8_ = local_98._0_8_;
    builtin_strncpy((char *)((long)&((pointer)local_138._0_8_)->_M_string_length + 6)," non-emp",8);
    builtin_strncpy((char *)((long)&((pointer)local_138._0_8_)->field_2 + 6),"ty NAME.",8);
    (((pointer)local_138._0_8_)->_M_dataplus)._M_p = (pointer)0x6562207473756d20;
    ((pointer)local_138._0_8_)->_M_string_length = 0x6e206e6576696720;
    local_138._8_8_ = local_98._0_8_;
    *(char *)(local_98._0_8_ + (long)&((pointer)local_138._0_8_)->_M_dataplus) = '\0';
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001a975d:
    local_50.field_2._M_allocated_capacity = local_128._0_8_;
    local_50._M_dataplus._M_p = (pointer)local_138._0_8_;
    if ((pointer)local_138._0_8_ != (pointer)local_128) {
LAB_001a976b:
      operator_delete(local_50._M_dataplus._M_p,
                      (ulong)((long)&(((pointer)local_50.field_2._M_allocated_capacity)->_M_dataplus
                                     )._M_p + 1));
    }
  }
  else {
    if (local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_138._0_8_ = local_128;
      local_98._0_8_ = (pointer)0x21;
      local_138._0_8_ = std::__cxx11::string::_M_create((ulong *)local_138,(ulong)local_98);
      local_128._0_8_ = local_98._0_8_;
      (((pointer)local_138._0_8_)->field_2)._M_allocated_capacity = 0x7974706d652d6e6f;
      builtin_strncpy((char *)((long)&((pointer)local_138._0_8_)->field_2 + 8)," COMMAND",8);
      (((pointer)local_138._0_8_)->_M_dataplus)._M_p = (pointer)0x6562207473756d20;
      ((pointer)local_138._0_8_)->_M_string_length = 0x6e206e6576696720;
      *(char *)&(((pointer)(local_138._0_8_ + 0x20))->_M_dataplus)._M_p = '.';
      local_138._8_8_ = local_98._0_8_;
      *(char *)(local_98._0_8_ + (long)&((pointer)local_138._0_8_)->_M_dataplus) = '\0';
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_001a975d;
    }
    pcVar1 = status->Makefile;
    pcVar3 = cmMakefile::GetTest(pcVar1,&local_108);
    if (pcVar3 == (cmTest *)0x0) {
      pcVar3 = cmMakefile::CreateTest(pcVar1,&local_108);
      pcVar3->OldStyle = false;
      cmTest::SetCommand(pcVar3,&local_b8);
      if (local_d8._M_string_length != 0) {
        local_138._0_8_ = (pointer)local_128;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"WORKING_DIRECTORY","");
        cmTest::SetProperty(pcVar3,(string *)local_138,&local_d8);
        if ((pointer)local_138._0_8_ != (pointer)local_128) {
          operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
        }
      }
      cmTest::SetCommandExpandLists(pcVar3,(bool)((byte)uVar4 & 1));
      pcVar5 = (cmTestGenerator *)operator_new(0x88);
      cmTestGenerator::cmTestGenerator(pcVar5,pcVar3,&local_68);
      local_138._0_8_ = pcVar5;
      cmMakefile::AddTestGenerator
                (pcVar1,(unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_> *)
                        local_138);
      if ((cmTestGenerator *)local_138._0_8_ != (cmTestGenerator *)0x0) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
      local_138._0_8_ = (pointer)0x0;
      bVar6 = true;
      goto LAB_001a9775;
    }
    local_138._0_8_ = (pointer)0x12;
    local_138._8_8_ = " given test NAME \"";
    local_128._0_8_ = local_108._M_string_length;
    local_128._8_8_ = local_108._M_dataplus._M_p;
    local_128._16_8_ = 0x29;
    local_128._24_8_ = "\" which already exists in this directory.";
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_138;
    cmCatViews_abi_cxx11_((string *)local_98,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_50.field_2._M_allocated_capacity = (size_type)local_88._M_dataplus;
    local_50._M_dataplus._M_p = (pointer)local_98._0_8_;
    if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) goto LAB_001a976b;
  }
LAB_001a9773:
  bVar6 = false;
LAB_001a9775:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  return bVar6;
}

Assistant:

bool cmAddTestCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (!args.empty() && args[0] == "NAME") {
    return cmAddTestCommandHandleNameMode(args, status);
  }

  // First argument is the name of the test Second argument is the name of
  // the executable to run (a target or external program) Remaining arguments
  // are the arguments to pass to the executable
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  // Collect the command with arguments.
  std::vector<std::string> command(args.begin() + 1, args.end());

  // Create the test but add a generator only the first time it is
  // seen.  This preserves behavior from before test generators.
  cmTest* test = mf.GetTest(args[0]);
  if (test) {
    // If the test was already added by a new-style signature do not
    // allow it to be duplicated.
    if (!test->GetOldStyle()) {
      status.SetError(cmStrCat(" given test name \"", args[0],
                               "\" which already exists in this directory."));
      return false;
    }
  } else {
    test = mf.CreateTest(args[0]);
    test->SetOldStyle(true);
    mf.AddTestGenerator(cm::make_unique<cmTestGenerator>(test));
  }
  test->SetCommand(command);

  return true;
}